

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rips_persistence.cpp
# Opt level: O2

void program_options(int argc,char **argv,string *off_file_points,string *filediag,
                    Filtration_value *threshold,int *dim_max,int *p,
                    Filtration_value *min_persistence)

{
  uint uVar1;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar2;
  char *pcVar3;
  typed_value<float,_char> *ptVar4;
  typed_value<int,_char> *ptVar5;
  options_description *poVar6;
  basic_command_line_parser<char> *this;
  size_type sVar7;
  ostream *poVar8;
  uint uVar9;
  allocator<char> local_336;
  allocator<char> local_335;
  int local_334;
  char **local_330;
  basic_parsed_options<char> local_328;
  variables_map vm;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0 [9];
  positional_options_description pos;
  basic_command_line_parser<char> local_228;
  options_description all;
  options_description visible;
  options_description hidden;
  
  local_334 = argc;
  local_330 = argv;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vm,"Hidden options",(allocator<char> *)&visible);
  uVar1 = (uint)boost::program_options::options_description::m_default_line_length;
  uVar9 = (uint)boost::program_options::options_description::m_default_line_length >> 1;
  boost::program_options::options_description::options_description
            (&hidden,(string *)&vm,
             (uint)boost::program_options::options_description::m_default_line_length,uVar9);
  std::__cxx11::string::~string((string *)&vm);
  _vm = (pointer)boost::program_options::options_description::add_options();
  ptVar2 = boost::program_options::value<std::__cxx11::string>(off_file_points);
  boost::program_options::options_description_easy_init::operator()
            ((char *)&vm,(value_semantic *)0x123465,(char *)ptVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vm,"Allowed options",(allocator<char> *)&all);
  boost::program_options::options_description::options_description(&visible,(string *)&vm,100,uVar9)
  ;
  std::__cxx11::string::~string((string *)&vm);
  _all = boost::program_options::options_description::add_options();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&all,"help,h");
  ptVar2 = boost::program_options::value<std::__cxx11::string>(filediag);
  _vm = (pointer)local_2f0;
  local_2f0[0]._M_local_buf[0] = '\0';
  ptVar2 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&vm);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"output-file,o",(char *)ptVar2);
  ptVar4 = boost::program_options::value<float>(threshold);
  local_228.super_cmdline = (cmdline)0x0;
  local_228._1_3_ = 0x7f8000;
  ptVar4 = boost::program_options::typed_value<float,_char>::default_value
                     (ptVar4,(float *)&local_228);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"max-edge-length,r",(char *)ptVar4);
  ptVar5 = boost::program_options::value<int>(dim_max);
  _pos = 1;
  ptVar5 = boost::program_options::typed_value<int,_char>::default_value(ptVar5,(int *)&pos);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"cpx-dimension,d",(char *)ptVar5);
  ptVar5 = boost::program_options::value<int>(p);
  local_328.options.
  super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xb;
  ptVar5 = boost::program_options::typed_value<int,_char>::default_value(ptVar5,(int *)&local_328);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"field-charac,p",(char *)ptVar5);
  ptVar4 = boost::program_options::value<float>(min_persistence);
  boost::program_options::options_description_easy_init::operator()
            (pcVar3,(value_semantic *)"min-persistence,m",(char *)ptVar4);
  std::__cxx11::string::~string((string *)&vm);
  boost::program_options::positional_options_description::positional_options_description(&pos);
  boost::program_options::positional_options_description::add((char *)&pos,0x123465);
  boost::program_options::options_description::options_description(&all,uVar1,uVar9);
  poVar6 = (options_description *)boost::program_options::options_description::add(&all);
  boost::program_options::options_description::add(poVar6);
  boost::program_options::variables_map::variables_map(&vm);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            (&local_228,local_334,local_330);
  this = boost::program_options::basic_command_line_parser<char>::options(&local_228,&all);
  boost::program_options::detail::cmdline::set_positional_options
            ((positional_options_description *)this);
  boost::program_options::basic_command_line_parser<char>::run(&local_328,this);
  boost::program_options::store((basic_parsed_options *)&local_328,&vm,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector(&local_328.options);
  boost::program_options::detail::cmdline::~cmdline(&local_228.super_cmdline);
  boost::program_options::notify(&vm);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"help",&local_335);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)local_2f0[0]._M_local_buf,(key_type *)&local_228);
  if (sVar7 == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,"input-file",&local_336)
    ;
    sVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)local_2f0[0]._M_local_buf,(key_type *)&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_228);
    if (sVar7 != 0) {
      boost::program_options::variables_map::~variables_map(&vm);
      boost::program_options::options_description::~options_description(&all);
      boost::program_options::positional_options_description::~positional_options_description(&pos);
      boost::program_options::options_description::~options_description(&visible);
      boost::program_options::options_description::~options_description(&hidden);
      return;
    }
  }
  else {
    std::__cxx11::string::~string((string *)&local_228);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::clog);
  std::operator<<((ostream *)&std::clog,
                  "Compute the persistent homology with coefficient field Z/pZ \n");
  std::operator<<((ostream *)&std::clog,"of a Rips complex defined on a set of input points.\n \n");
  std::operator<<((ostream *)&std::clog,
                  "The output diagram contains one bar per line, written with the convention: \n");
  std::operator<<((ostream *)&std::clog,"   p   dim b d \n");
  std::operator<<((ostream *)&std::clog,"where dim is the dimension of the homological feature,\n");
  std::operator<<((ostream *)&std::clog,
                  "b and d are respectively the birth and death of the feature and \n");
  poVar8 = std::operator<<((ostream *)&std::clog,
                           "p is the characteristic of the field Z/pZ used for homology coefficients."
                          );
  poVar8 = std::endl<char,std::char_traits<char>>(poVar8);
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)&std::clog,"Usage: ");
  poVar8 = std::operator<<(poVar8,*local_330);
  poVar8 = std::operator<<(poVar8," [options] input-file");
  poVar8 = std::endl<char,std::char_traits<char>>(poVar8);
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = (ostream *)boost::program_options::operator<<((ostream *)&std::clog,&visible);
  std::endl<char,std::char_traits<char>>(poVar8);
  exit(-1);
}

Assistant:

void program_options(int argc, char* argv[], std::string& off_file_points, std::string& filediag,
                     Filtration_value& threshold, int& dim_max, int& p, Filtration_value& min_persistence) {
  namespace po = boost::program_options;
  po::options_description hidden("Hidden options");
  hidden.add_options()("input-file", po::value<std::string>(&off_file_points),
                       "Name of an OFF file containing a point set.\n");

  po::options_description visible("Allowed options", 100);
  visible.add_options()("help,h", "produce help message")(
      "output-file,o", po::value<std::string>(&filediag)->default_value(std::string()),
      "Name of file in which the persistence diagram is written. Default print in standard output")(
      "max-edge-length,r",
      po::value<Filtration_value>(&threshold)->default_value(std::numeric_limits<Filtration_value>::infinity()),
      "Maximal length of an edge for the Rips complex construction.")(
      "cpx-dimension,d", po::value<int>(&dim_max)->default_value(1),
      "Maximal dimension of the Rips complex we want to compute.")(
      "field-charac,p", po::value<int>(&p)->default_value(11),
      "Characteristic p of the coefficient field Z/pZ for computing homology.")(
      "min-persistence,m", po::value<Filtration_value>(&min_persistence),
      "Minimal lifetime of homology feature to be recorded. Default is 0. Enter a negative value to see zero length "
      "intervals");

  po::positional_options_description pos;
  pos.add("input-file", 1);

  po::options_description all;
  all.add(visible).add(hidden);

  po::variables_map vm;
  po::store(po::command_line_parser(argc, argv).options(all).positional(pos).run(), vm);
  po::notify(vm);

  if (vm.count("help") || !vm.count("input-file")) {
    std::clog << std::endl;
    std::clog << "Compute the persistent homology with coefficient field Z/pZ \n";
    std::clog << "of a Rips complex defined on a set of input points.\n \n";
    std::clog << "The output diagram contains one bar per line, written with the convention: \n";
    std::clog << "   p   dim b d \n";
    std::clog << "where dim is the dimension of the homological feature,\n";
    std::clog << "b and d are respectively the birth and death of the feature and \n";
    std::clog << "p is the characteristic of the field Z/pZ used for homology coefficients." << std::endl << std::endl;

    std::clog << "Usage: " << argv[0] << " [options] input-file" << std::endl << std::endl;
    std::clog << visible << std::endl;
    exit(-1);
  }
}